

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O1

type * __thiscall
rest_rpc::rpc_client::call<5000ul,std::__cxx11::string,char_const(&)[6]>
          (type *__return_storage_ptr__,rpc_client *this,string *rpc_name,char (*args) [6])

{
  future_status fVar1;
  out_of_range *this_00;
  future_result<rest_rpc::req_result> future_result;
  req_result local_48;
  future_result<rest_rpc::req_result> local_28;
  
  async_call<(rest_rpc::CallModel)0,char_const(&)[6]>(&local_28,this,rpc_name,args);
  local_48.data_._M_dataplus._M_p = (pointer)0x1388;
  if (local_28.future.super___basic_future<rest_rpc::req_result>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (_State_baseV2 *)0x0) {
    std::__throw_future_error(3);
  }
  else {
    fVar1 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000l>>
                      (local_28.future.super___basic_future<rest_rpc::req_result>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(duration<long,_std::ratio<1L,_1000L>_> *)&local_48);
    if (1 < fVar1 - timeout) {
      std::future<rest_rpc::req_result>::get(&local_48,&local_28.future);
      req_result::as<std::__cxx11::string>(__return_storage_ptr__,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.data_._M_dataplus._M_p != &local_48.data_.field_2) {
        operator_delete(local_48.data_._M_dataplus._M_p);
      }
      if (local_28.future.super___basic_future<rest_rpc::req_result>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.future.super___basic_future<rest_rpc::req_result>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return __return_storage_ptr__;
    }
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"timeout or deferred");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

typename std::enable_if<!std::is_void<T>::value, T>::type
  call(const std::string &rpc_name, Args &&...args) {
    auto future_result =
        async_call<FUTURE>(rpc_name, std::forward<Args>(args)...);
    auto status = future_result.wait_for(std::chrono::milliseconds(TIMEOUT));
    if (status == std::future_status::timeout ||
        status == std::future_status::deferred) {
      throw std::out_of_range("timeout or deferred");
    }

    return future_result.get().template as<T>();
  }